

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

FrameBuffer * __thiscall Imf_2_5::InputFile::frameBuffer(InputFile *this)

{
  Data *pDVar1;
  long lVar2;
  ScanLineInputFile *in_RDI;
  Lock lock;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  Mutex *in_stack_ffffffffffffffe8;
  size_t *local_8;
  
  pDVar1 = in_RDI->_data;
  lVar2._0_1_ = pDVar1->fileIsComplete;
  lVar2._1_3_ = *(undefined3 *)&pDVar1->field_0xc9;
  lVar2._4_4_ = pDVar1->nextLineBufferMinY;
  if (lVar2 == 0) {
    if ((in_RDI->_data->field_0x64 & 1) == 0) {
      local_8 = (size_t *)ScanLineInputFile::frameBuffer(in_RDI);
    }
    else {
      IlmThread_2_5::Lock::Lock
                ((Lock *)in_RDI,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
      local_8 = &(in_RDI->_data->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      IlmThread_2_5::Lock::~Lock
                ((Lock *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    }
  }
  else {
    local_8 = (size_t *)
              CompositeDeepScanLine::frameBuffer
                        (*(CompositeDeepScanLine **)&in_RDI->_data->fileIsComplete);
  }
  return (FrameBuffer *)local_8;
}

Assistant:

const FrameBuffer &
InputFile::frameBuffer () const
{
    if(_data->compositor)
    {
        return _data->compositor->frameBuffer();
    }
    else if(_data->isTiled)
    {
	Lock lock (*_data);
	return _data->tFileBuffer;
    }
    else
    {
	return _data->sFile->frameBuffer();
    }
}